

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::
CartesianProductGenerator<libaom_test::CodecFactory_const*,libaom_test::TestMode,aom_rc_mode,int>::
IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul>>::AdvanceIfEnd<1ul>
          (IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul>> *this)

{
  long *plVar1;
  char cVar2;
  undefined8 uVar3;
  
  if ((*(long **)(this + 0x60) != *(long **)(this + 0x40)) &&
     (cVar2 = (**(code **)(**(long **)(this + 0x60) + 0x30))(), cVar2 == '\0')) {
    return;
  }
  uVar3 = (**(code **)(**(long **)(this + 0x20) + 0x20))();
  plVar1 = *(long **)(this + 0x60);
  *(undefined8 *)(this + 0x60) = uVar3;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  (**(code **)(**(long **)(this + 0x68) + 0x18))();
  if (*(long **)(this + 0x68) == *(long **)(this + 0x48)) {
    return;
  }
  (**(code **)(**(long **)(this + 0x68) + 0x30))();
  return;
}

Assistant:

void AdvanceIfEnd() {
      if (std::get<ThisI>(current_) != std::get<ThisI>(end_)) return;

      bool last = ThisI == 0;
      if (last) {
        // We are done. Nothing else to propagate.
        return;
      }

      constexpr size_t NextI = ThisI - (ThisI != 0);
      std::get<ThisI>(current_) = std::get<ThisI>(begin_);
      ++std::get<NextI>(current_);
      AdvanceIfEnd<NextI>();
    }